

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O0

void __thiscall QGraphicsView::keyPressEvent(QGraphicsView *this,QKeyEvent *event)

{
  bool bVar1;
  QGraphicsViewPrivate *pQVar2;
  QObject *pQVar3;
  QEvent *in_RSI;
  QKeyEvent *in_RDI;
  QAbstractScrollArea *unaff_retaddr;
  QGraphicsViewPrivate *d;
  
  pQVar2 = d_func((QGraphicsView *)0xa3d7d1);
  bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QGraphicsScene> *)0xa3d7e7);
  if ((bVar1) && ((*(uint *)&pQVar2->field_0x300 & 1) != 0)) {
    pQVar3 = &::QPointer::operator_cast_to_QGraphicsScene_((QPointer<QGraphicsScene> *)0xa3d822)->
              super_QObject;
    QCoreApplication::sendEvent(pQVar3,in_RSI);
    bVar1 = QEvent::isAccepted(in_RSI);
    if (!bVar1) {
      QAbstractScrollArea::keyPressEvent(unaff_retaddr,in_RDI);
    }
  }
  else {
    QAbstractScrollArea::keyPressEvent(unaff_retaddr,in_RDI);
  }
  return;
}

Assistant:

void QGraphicsView::keyPressEvent(QKeyEvent *event)
{
    Q_D(QGraphicsView);
    if (!d->scene || !d->sceneInteractionAllowed) {
        QAbstractScrollArea::keyPressEvent(event);
        return;
    }
    QCoreApplication::sendEvent(d->scene, event);
    if (!event->isAccepted())
        QAbstractScrollArea::keyPressEvent(event);
}